

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O3

idx_t __thiscall duckdb::ReservoirSample::GetActiveSampleCount(ReservoirSample *this)

{
  unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
  *this_00;
  pointer pBVar1;
  idx_t iVar2;
  
  this_00 = &(this->super_BlockingSample).base_reservoir_sample;
  pBVar1 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
           ::operator->(this_00);
  if ((pBVar1->reservoir_weights).c.
      super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pBVar1->reservoir_weights).c.
      super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar2 = this->sel_size;
  }
  else {
    pBVar1 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
             ::operator->(this_00);
    iVar2 = (long)(pBVar1->reservoir_weights).c.
                  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pBVar1->reservoir_weights).c.
                  super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
  }
  return iVar2;
}

Assistant:

idx_t ReservoirSample::GetActiveSampleCount() const {
	switch (GetSamplingState()) {
	case SamplingState::RANDOM:
		return sel_size;
	case SamplingState::RESERVOIR:
		return base_reservoir_sample->reservoir_weights.size();
	default:
		throw InternalException("Sampling State is INVALID");
	}
}